

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_<double,int,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar15 [16];
  size_t *row;
  double m_prev;
  double s;
  double m;
  size_t added;
  size_t cnt;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  byte local_92;
  ulong *local_90;
  unsigned_long *local_88;
  unsigned_long *in_stack_ffffffffffffff80;
  unsigned_long *__val;
  unsigned_long *in_stack_ffffffffffffff88;
  unsigned_long *puVar17;
  unsigned_long *in_stack_ffffffffffffff90;
  unsigned_long *__first;
  unsigned_long *local_68;
  long local_48;
  undefined4 uVar16;
  
  if (*(int *)((long)row + in_RCX * 4) == *(int *)((long)row + in_RCX * 4 + 4)) {
    *(undefined8 *)m_prev = 0;
    *(undefined8 *)s = 0;
  }
  else {
    local_48 = (long)*(int *)((long)row + in_RCX * 4);
    lVar4 = (long)(*(int *)((long)row + in_RCX * 4 + 4) + -1);
    iVar1 = *(int *)(in_R9 + lVar4 * 4);
    local_90 = std::lower_bound<unsigned_long*,unsigned_long>
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80);
    local_68 = (unsigned_long *)((in_RDX - in_RSI) + 1);
    __first = (unsigned_long *)0x0;
    puVar17 = (unsigned_long *)0x0;
    __val = (unsigned_long *)0x0;
    local_88 = (unsigned_long *)0x0;
    while( true ) {
      bVar6 = false;
      if ((local_90 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar6 = false, local_48 != lVar4 + 1)
         ) {
        bVar6 = *local_90 <= (ulong)(long)iVar1;
      }
      if (!bVar6) break;
      if (*(int *)(in_R9 + local_48 * 4) == (int)*local_90) {
        uVar2 = std::isnan(*(double *)(in_R8 + local_48 * 8));
        local_92 = 1;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf(*(double *)(in_R8 + local_48 * 8));
          local_92 = (byte)iVar3;
        }
        if ((local_92 & 1) == 0) {
          if (__first == (unsigned_long *)0x0) {
            local_88 = *(unsigned_long **)(in_R8 + local_48 * 8);
          }
          __first = (unsigned_long *)((long)__first + 1);
          auVar9._8_4_ = (int)((ulong)__first >> 0x20);
          auVar9._0_8_ = __first;
          auVar9._12_4_ = 0x45300000;
          puVar17 = (unsigned_long *)
                    ((*(double *)(in_R8 + local_48 * 8) - (double)puVar17) /
                     ((auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)__first) - 4503599627370496.0)) +
                    (double)puVar17);
          dVar14 = *(double *)(in_R8 + local_48 * 8) - (double)local_88;
          local_88 = puVar17;
          __val = (unsigned_long *)
                  fma(*(double *)(in_R8 + local_48 * 8) - (double)puVar17,dVar14,(double)__val);
          puVar17 = local_88;
        }
        else {
          local_68 = (unsigned_long *)((long)local_68 + -1);
        }
        if ((local_90 == (ulong *)(in_RDI + in_RDX * 8)) || (local_48 == lVar4)) break;
        local_90 = local_90 + 1;
        piVar5 = std::lower_bound<int*,unsigned_long>((int *)__first,(int *)puVar17,__val);
        local_48 = (long)piVar5 - in_R9 >> 2;
      }
      else if ((int)*local_90 < *(int *)(in_R9 + local_48 * 4)) {
        local_90 = std::lower_bound<unsigned_long*,int>(__first,puVar17,(int *)__val);
      }
      else {
        piVar5 = std::lower_bound<int*,unsigned_long>((int *)__first,(int *)puVar17,__val);
        local_48 = (long)piVar5 - in_R9 >> 2;
      }
    }
    if (__first == (unsigned_long *)0x0) {
      *(undefined8 *)s = 0;
      *(undefined8 *)m_prev = 0;
    }
    else {
      uVar8 = SUB84(local_68,0);
      uVar13 = (undefined4)((ulong)local_68 >> 0x20);
      if (__first < local_68) {
        uVar16 = (undefined4)((ulong)__first >> 0x20);
        auVar15._8_4_ = uVar16;
        auVar15._0_8_ = __first;
        auVar15._12_4_ = 0x45300000;
        dVar14 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)__first) - 4503599627370496.0);
        auVar10._8_4_ = uVar13;
        auVar10._0_8_ = local_68;
        auVar10._12_4_ = 0x45300000;
        __val = (unsigned_long *)
                ((double)puVar17 * (double)puVar17 *
                 dVar14 * (1.0 - dVar14 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                                          ((double)CONCAT44(0x43300000,uVar8) - 4503599627370496.0))
                          ) + (double)__val);
        auVar7._8_4_ = uVar16;
        auVar7._0_8_ = __first;
        auVar7._12_4_ = 0x45300000;
        auVar11._8_4_ = uVar13;
        auVar11._0_8_ = local_68;
        auVar11._12_4_ = 0x45300000;
        puVar17 = (unsigned_long *)
                  ((((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)__first) - 4503599627370496.0)) /
                   ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar8) - 4503599627370496.0))) * (double)puVar17);
      }
      *(unsigned_long **)s = puVar17;
      auVar12._8_4_ = uVar13;
      auVar12._0_8_ = local_68;
      auVar12._12_4_ = 0x45300000;
      *(double *)m_prev =
           SQRT((double)__val /
                ((auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar8) - 4503599627370496.0)));
    }
  }
  return;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}